

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

InternalParseResult * __thiscall
Catch::clara::detail::ParserBase::parse
          (InternalParseResult *__return_storage_ptr__,ParserBase *this,Args *args)

{
  pointer pcVar1;
  long *local_68 [2];
  long local_58 [2];
  TokenStream local_48;
  
  pcVar1 = (args->m_exeName)._M_dataplus._M_p;
  local_68[0] = local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + (args->m_exeName)._M_string_length);
  TokenStream::TokenStream
            (&local_48,
             (args->m_args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (args->m_args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  (*this->_vptr_ParserBase[3])(__return_storage_ptr__,this,local_68,&local_48);
  std::vector<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>::~vector
            (&local_48.m_tokenBuffer);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse( Args const &args ) const -> InternalParseResult {
            return parse( args.exeName(), TokenStream( args ) );
        }